

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.hpp
# Opt level: O1

Task __thiscall
tf::FlowBuilder::
exclusive_scan<std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__cxx11::string,std::plus<std::__cxx11::string>>
          (FlowBuilder *this,anon_class_64_5_1a9029b9_conflict *first,undefined8 last,
          undefined8 d_first,undefined8 init,long *param_6)

{
  long *local_90;
  long local_88;
  long local_80 [2];
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  long *local_58 [2];
  long local_48 [3];
  
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,*param_6,param_6[1] + *param_6);
  local_70 = last;
  local_68 = d_first;
  local_60 = init;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)local_58,local_90,local_88 + (long)local_90);
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_taskflow_algorithm_scan_hpp:431:10),_nullptr>
            (this,first);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return (Task)(Node *)this;
}

Assistant:

Task FlowBuilder::exclusive_scan(B first, E last, D d_first, T init, BOP bop) {
  return emplace(make_exclusive_scan_task(first, last, d_first, init, bop));
}